

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaIso2.c
# Opt level: O1

int Gia_Iso2ManCheckIsoPair
              (Gia_Man_t *p,Vec_Int_t *vVec0,Vec_Int_t *vVec1,Vec_Int_t *vMap0,Vec_Int_t *vMap1)

{
  Gia_Obj_t *pGVar1;
  int iVar2;
  Gia_Obj_t *pGVar3;
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  uint uVar8;
  uint uVar9;
  int *piVar10;
  uint uVar11;
  uint uVar12;
  uint uVar13;
  int *piVar14;
  uint uVar15;
  bool bVar16;
  
  if (0 < (long)vVec0->nSize) {
    uVar7 = 0;
    uVar6 = (ulong)(uint)vVec1->nSize;
    if (vVec1->nSize < 1) {
      uVar6 = uVar7;
    }
    do {
      if (uVar6 == uVar7) goto LAB_0074da4e;
      uVar13 = vVec0->pArray[uVar7];
      uVar15 = vVec1->pArray[uVar7];
      if (uVar13 != uVar15) {
        if (((((int)uVar13 < 0) || (iVar2 = p->nObjs, iVar2 <= (int)uVar13)) || ((int)uVar15 < 0))
           || (iVar2 <= (int)uVar15)) {
          __assert_fail("v >= 0 && v < p->nObjs",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                        ,0x1d1,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
        }
        pGVar3 = p->pObjs;
        pGVar1 = pGVar3 + uVar13;
        if (pGVar1->Value != pGVar3[uVar15].Value) {
          return 0;
        }
        uVar4 = *(ulong *)pGVar1;
        uVar9 = (uint)uVar4;
        if ((uVar4 & 0x1fffffff) != 0x1fffffff && -1 < (int)uVar9) {
          pGVar3 = pGVar3 + uVar15;
          uVar5 = *(ulong *)pGVar3;
          uVar8 = (uint)(uVar4 >> 0x20);
          uVar11 = (uint)(uVar5 >> 0x20);
          uVar12 = (uint)uVar5;
          if (pGVar1[-(uVar4 >> 0x20 & 0x1fffffff)].Value < pGVar1[-(uVar4 & 0x1fffffff)].Value) {
            if (pGVar3[-(uVar5 & 0x1fffffff)].Value <= pGVar3[-(uVar5 >> 0x20 & 0x1fffffff)].Value)
            {
              if ((((uint)(uVar5 >> 0x1d) & 7 ^ uVar8 >> 0x1d) & 1) != 0) {
                return 0;
              }
              if (((uVar11 >> 0x1d ^ (uint)(uVar4 >> 0x1d) & 7) & 1) != 0) {
                return 0;
              }
              if (iVar2 <= (int)uVar13) goto LAB_0074da8c;
              uVar8 = uVar13 - (uVar8 & 0x1fffffff);
              if (((int)uVar8 < 0) || (vMap0->nSize <= (int)uVar8)) goto LAB_0074da4e;
              if (iVar2 <= (int)uVar15) goto LAB_0074da8c;
              uVar12 = uVar15 - (uVar12 & 0x1fffffff);
              if (((int)uVar12 < 0) || (vMap1->nSize <= (int)uVar12)) goto LAB_0074da4e;
              piVar10 = vMap0->pArray;
              piVar14 = vMap1->pArray;
              if (piVar10[uVar8] != piVar14[uVar12]) {
                return 0;
              }
              uVar13 = uVar13 - (uVar9 & 0x1fffffff);
              if (((((int)uVar13 < 0) || (vMap0->nSize <= (int)uVar13)) ||
                  (uVar15 = uVar15 - (uVar11 & 0x1fffffff), (int)uVar15 < 0)) ||
                 (vMap1->nSize <= (int)uVar15)) goto LAB_0074da4e;
LAB_0074da09:
              if (piVar10[uVar13] != piVar14[uVar15]) {
                return 0;
              }
              goto LAB_0074da28;
            }
            if ((((uVar5 ^ uVar4) & 0x2000000000000000) != 0) ||
               (((uVar12 ^ uVar9) >> 0x1d & 1) != 0)) {
              return 0;
            }
            if (iVar2 <= (int)uVar13) {
LAB_0074da8c:
              __assert_fail("p->pObjs <= pObj && pObj < p->pObjs + p->nObjs",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                            ,0x1d9,"int Gia_ObjId(Gia_Man_t *, Gia_Obj_t *)");
            }
            uVar8 = uVar13 - (uVar8 & 0x1fffffff);
            if (((int)uVar8 < 0) || (vMap0->nSize <= (int)uVar8)) goto LAB_0074da4e;
            if (iVar2 <= (int)uVar15) goto LAB_0074da8c;
            uVar11 = uVar15 - (uVar11 & 0x1fffffff);
            if (((int)uVar11 < 0) || (vMap1->nSize <= (int)uVar11)) {
LAB_0074da4e:
              __assert_fail("i >= 0 && i < p->nSize",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                            ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
            }
            if (vMap0->pArray[uVar8] != vMap1->pArray[uVar11]) {
              return 0;
            }
            uVar13 = uVar13 - (uVar9 & 0x1fffffff);
            if (((((int)uVar13 < 0) || (vMap0->nSize <= (int)uVar13)) ||
                (uVar15 = uVar15 - (uVar12 & 0x1fffffff), (int)uVar15 < 0)) ||
               (vMap1->nSize <= (int)uVar15)) goto LAB_0074da4e;
            bVar16 = vMap0->pArray[uVar13] == vMap1->pArray[uVar15];
          }
          else {
            if (pGVar3[-(uVar5 & 0x1fffffff)].Value <= pGVar3[-(uVar5 >> 0x20 & 0x1fffffff)].Value)
            {
              if (((uVar12 ^ uVar9) >> 0x1d & 1) != 0) {
                return 0;
              }
              if (((uVar5 ^ uVar4) & 0x2000000000000000) != 0) {
                return 0;
              }
              if (iVar2 <= (int)uVar13) goto LAB_0074da8c;
              uVar9 = uVar13 - (uVar9 & 0x1fffffff);
              if (((int)uVar9 < 0) || (vMap0->nSize <= (int)uVar9)) goto LAB_0074da4e;
              if (iVar2 <= (int)uVar15) goto LAB_0074da8c;
              uVar12 = uVar15 - (uVar12 & 0x1fffffff);
              if (((int)uVar12 < 0) || (vMap1->nSize <= (int)uVar12)) goto LAB_0074da4e;
              piVar10 = vMap0->pArray;
              piVar14 = vMap1->pArray;
              if (piVar10[uVar9] != piVar14[uVar12]) {
                return 0;
              }
              uVar13 = uVar13 - (uVar8 & 0x1fffffff);
              if (((((int)uVar13 < 0) || (vMap0->nSize <= (int)uVar13)) ||
                  (uVar15 = uVar15 - (uVar11 & 0x1fffffff), (int)uVar15 < 0)) ||
                 (vMap1->nSize <= (int)uVar15)) goto LAB_0074da4e;
              goto LAB_0074da09;
            }
            if (((uVar11 >> 0x1d ^ (uint)(uVar4 >> 0x1d) & 7) & 1) != 0) {
              return 0;
            }
            if ((((uint)(uVar5 >> 0x1d) & 7 ^ uVar8 >> 0x1d) & 1) != 0) {
              return 0;
            }
            if (iVar2 <= (int)uVar13) goto LAB_0074da8c;
            uVar9 = uVar13 - (uVar9 & 0x1fffffff);
            if (((int)uVar9 < 0) || (vMap0->nSize <= (int)uVar9)) goto LAB_0074da4e;
            if (iVar2 <= (int)uVar15) goto LAB_0074da8c;
            uVar11 = uVar15 - (uVar11 & 0x1fffffff);
            if (((int)uVar11 < 0) || (vMap1->nSize <= (int)uVar11)) goto LAB_0074da4e;
            if (vMap0->pArray[uVar9] != vMap1->pArray[uVar11]) {
              return 0;
            }
            uVar13 = uVar13 - (uVar8 & 0x1fffffff);
            if (((((int)uVar13 < 0) || (vMap0->nSize <= (int)uVar13)) ||
                (uVar15 = uVar15 - (uVar12 & 0x1fffffff), (int)uVar15 < 0)) ||
               (vMap1->nSize <= (int)uVar15)) goto LAB_0074da4e;
            bVar16 = vMap0->pArray[uVar13] == vMap1->pArray[uVar15];
          }
          if (!bVar16) {
            return 0;
          }
        }
      }
LAB_0074da28:
      uVar7 = uVar7 + 1;
    } while ((long)vVec0->nSize != uVar7);
  }
  return 1;
}

Assistant:

int Gia_Iso2ManCheckIsoPair( Gia_Man_t * p, Vec_Int_t * vVec0, Vec_Int_t * vVec1, Vec_Int_t * vMap0, Vec_Int_t * vMap1 )
{
    Gia_Obj_t * pObj0, * pObj1;
    int k, iObj0, iObj1;
    Vec_IntForEachEntryTwo( vVec0, vVec1, iObj0, iObj1, k )
    {
        if ( iObj0 == iObj1 )
            continue;
        pObj0 = Gia_ManObj(p, iObj0);
        pObj1 = Gia_ManObj(p, iObj1);
        if ( pObj0->Value != pObj1->Value )
            return 0;
        assert( pObj0->Value == pObj1->Value );
        if ( !Gia_ObjIsAnd(pObj0) )
            continue;
        if ( Gia_ObjFanin0(pObj0)->Value <= Gia_ObjFanin1(pObj0)->Value )
        {
            if ( Gia_ObjFanin0(pObj1)->Value <= Gia_ObjFanin1(pObj1)->Value )
            {
                if ( Gia_ObjFaninC0(pObj0) != Gia_ObjFaninC0(pObj1)  || Gia_ObjFaninC1(pObj0) != Gia_ObjFaninC1(pObj1)   ||
                     Vec_IntEntry(vMap0, Gia_ObjFaninId0p(p, pObj0)) != Vec_IntEntry( vMap1, Gia_ObjFaninId0p(p, pObj1)) || 
                     Vec_IntEntry(vMap0, Gia_ObjFaninId1p(p, pObj0)) != Vec_IntEntry( vMap1, Gia_ObjFaninId1p(p, pObj1)) )
                     return 0;
            }
            else
            {
                if ( Gia_ObjFaninC0(pObj0) != Gia_ObjFaninC1(pObj1)  || Gia_ObjFaninC1(pObj0) != Gia_ObjFaninC0(pObj1)   ||
                     Vec_IntEntry(vMap0, Gia_ObjFaninId0p(p, pObj0)) != Vec_IntEntry( vMap1, Gia_ObjFaninId1p(p, pObj1)) || 
                     Vec_IntEntry(vMap0, Gia_ObjFaninId1p(p, pObj0)) != Vec_IntEntry( vMap1, Gia_ObjFaninId0p(p, pObj1)) )
                     return 0;
            }
        }
        else
        {
            if ( Gia_ObjFanin0(pObj1)->Value <= Gia_ObjFanin1(pObj1)->Value )
            {
                if ( Gia_ObjFaninC1(pObj0) != Gia_ObjFaninC0(pObj1)  || Gia_ObjFaninC0(pObj0) != Gia_ObjFaninC1(pObj1)   ||
                     Vec_IntEntry(vMap0, Gia_ObjFaninId1p(p, pObj0)) != Vec_IntEntry( vMap1, Gia_ObjFaninId0p(p, pObj1)) || 
                     Vec_IntEntry(vMap0, Gia_ObjFaninId0p(p, pObj0)) != Vec_IntEntry( vMap1, Gia_ObjFaninId1p(p, pObj1)) )
                     return 0;
            }
            else
            {
                if ( Gia_ObjFaninC1(pObj0) != Gia_ObjFaninC1(pObj1)  || Gia_ObjFaninC0(pObj0) != Gia_ObjFaninC0(pObj1)   ||
                     Vec_IntEntry(vMap0, Gia_ObjFaninId1p(p, pObj0)) != Vec_IntEntry( vMap1, Gia_ObjFaninId1p(p, pObj1)) || 
                     Vec_IntEntry(vMap0, Gia_ObjFaninId0p(p, pObj0)) != Vec_IntEntry( vMap1, Gia_ObjFaninId0p(p, pObj1)) )
                     return 0;
            }
        }
    }
    return 1;
}